

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

void __thiscall
doctest::detail::
ContextScope<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/utilities/SystemUtilsTests.cpp:17:9)>
::stringify(ContextScope<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_utilities_SystemUtilsTests_cpp:17:9)>
            *this,ostream *s)

{
  ostream *in_stack_00000048;
  anon_class_8_1_a0d220b0_for_lambda_ *in_stack_00000050;
  
  anon_class_8_1_a0d220b0_for_lambda_::operator()(in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void stringify(std::ostream* s) const override { lambda_(s); }